

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

ExpEmit __thiscall FxFlopFunctionCall::Emit(FxFlopFunctionCall *this,VMFunctionBuilder *build)

{
  FxExpression *pFVar1;
  uint uVar2;
  ExpEmit EVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  ExpEmit from;
  uint extraout_var;
  
  pFVar1 = *(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array;
  if ((this->super_FxExpression).ValueType != pFVar1->ValueType) {
    __assert_fail("ValueType == ArgList[0]->ValueType",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0x200e,"virtual ExpEmit FxFlopFunctionCall::Emit(VMFunctionBuilder *)");
  }
  EVar3._0_4_ = (*pFVar1->_vptr_FxExpression[9])();
  EVar3.Konst = (bool)(char)extraout_var;
  EVar3.Fixed = (bool)(char)(extraout_var >> 8);
  EVar3.Final = (bool)(char)(extraout_var >> 0x10);
  EVar3.Target = (bool)(char)(extraout_var >> 0x18);
  from = EVar3;
  if ((char)extraout_var == '\0') {
    if (((this->super_FxExpression).ValueType)->RegCount == '\x01') {
      if ((extraout_var & 0x100) == 0) {
        uVar4 = ((ulong)extraout_var & 0xfffffe00) << 0x20;
        uVar5 = (ulong)(EVar3._0_4_ & 0xff000000);
        uVar6 = EVar3._0_4_ >> 0x10 & 0xff;
        uVar2 = EVar3._0_4_;
      }
      else {
        uVar6 = (uint)(((ulong)EVar3._0_4_ & 0xff0000) >> 0x10);
        uVar2 = VMFunctionBuilder::RegAvailability::Get
                          (build->Registers + (((ulong)EVar3._0_4_ & 0xff0000) >> 0x10),1);
        ExpEmit::Free(&from,build);
        uVar5 = 0x1000000;
        uVar4 = 0;
      }
      VMFunctionBuilder::Emit
                (build,0xac,uVar2 & 0xffff,EVar3._0_4_ & 0xffff,FxFlops[this->Index].Flop);
      TDeletingArray<FxExpression_*,_FxExpression_*>::DeleteAndClear(&this->ArgList);
      TArray<FxExpression_*,_FxExpression_*>::ShrinkToFit
                (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>);
      return (ExpEmit)((ulong)(uVar2 & 0xffff) | (ulong)(uVar6 << 0x10) | uVar5 | uVar4);
    }
    __assert_fail("ValueType->GetRegCount() == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0x2012,"virtual ExpEmit FxFlopFunctionCall::Emit(VMFunctionBuilder *)");
  }
  __assert_fail("from.Konst == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                ,0x2011,"virtual ExpEmit FxFlopFunctionCall::Emit(VMFunctionBuilder *)");
}

Assistant:

ExpEmit FxFlopFunctionCall::Emit(VMFunctionBuilder *build)
{
	assert(ValueType == ArgList[0]->ValueType);
	ExpEmit from = ArgList[0]->Emit(build);
	ExpEmit to;
	assert(from.Konst == 0);
	assert(ValueType->GetRegCount() == 1);
	// Do it in-place, unless a local variable
	if (from.Fixed)
	{
		to = ExpEmit(build, from.RegType);
		from.Free(build);
	}
	else
	{
		to = from;
	}

	build->Emit(OP_FLOP, to.RegNum, from.RegNum, FxFlops[Index].Flop);
	ArgList.DeleteAndClear();
	ArgList.ShrinkToFit();
	return to;
}